

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_35::InMemoryFile::MmapDisposer::disposeImpl
          (MmapDisposer *this,void *firstElement,size_t elementSize,size_t elementCount,
          size_t capacity,_func_void_void_ptr *destroyElement)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *this_00;
  uint *puVar1;
  InMemoryFile *pIVar2;
  Disposer *pDVar3;
  
  pIVar2 = (this->ref).ptr;
  this_00 = &pIVar2->impl;
  _::Mutex::lock(&this_00->mutex,EXCLUSIVE);
  puVar1 = &(pIVar2->impl).value.mmapCount;
  *puVar1 = *puVar1 - 1;
  _::Mutex::unlock(&this_00->mutex,EXCLUSIVE);
  pIVar2 = (this->ref).ptr;
  if (pIVar2 != (InMemoryFile *)0x0) {
    (this->ref).ptr = (InMemoryFile *)0x0;
    pDVar3 = (this->ref).disposer;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,(pIVar2->super_File).super_ReadableFile.super_FsNode._vptr_FsNode[-2] +
                      (long)&(pIVar2->super_File).super_ReadableFile.super_FsNode._vptr_FsNode);
  }
  operator_delete(this,0x18);
  return;
}

Assistant:

void disposeImpl(void* firstElement, size_t elementSize, size_t elementCount,
                     size_t capacity, void (*destroyElement)(void*)) const override {
      delete this;
    }